

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O2

void ccall_classify_ct(CTState *cts,CType *ct,int *rcl,CTSize ofs)

{
  uint uVar1;
  CTSize CVar2;
  uint uVar3;
  CType *ct_00;
  
  uVar1 = ct->info;
  if (uVar1 >> 0x1c == 1) {
    ccall_classify_struct(cts,ct,rcl,ofs);
    return;
  }
  if (uVar1 >> 0x1c == 3) {
    ct_00 = (CType *)((long)&cts->tab->info + (ulong)((uVar1 & 0xffff) << 4));
    CVar2 = ct_00->size;
    uVar1 = ct->size;
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + CVar2) {
      ccall_classify_ct(cts,ct_00,rcl,ofs + uVar3);
    }
  }
  else {
    uVar3 = 4;
    if ((ct->size - 1 & ofs) == 0) {
      uVar3 = ((uVar1 & 0xf4000000) == 0x4000000) + 1;
    }
    rcl[7 < ofs] = rcl[7 < ofs] | uVar3;
  }
  return;
}

Assistant:

static void ccall_classify_ct(CTState *cts, CType *ct, int *rcl, CTSize ofs)
{
  if (ctype_isarray(ct->info)) {
    CType *cct = ctype_rawchild(cts, ct);
    CTSize eofs, esz = cct->size, asz = ct->size;
    for (eofs = 0; eofs < asz; eofs += esz)
      ccall_classify_ct(cts, cct, rcl, ofs+eofs);
  } else if (ctype_isstruct(ct->info)) {
    ccall_classify_struct(cts, ct, rcl, ofs);
  } else {
    int cl = ctype_isfp(ct->info) ? CCALL_RCL_SSE : CCALL_RCL_INT;
    lua_assert(ctype_hassize(ct->info));
    if ((ofs & (ct->size-1))) cl = CCALL_RCL_MEM;  /* Unaligned. */
    rcl[(ofs >= 8)] |= cl;
  }
}